

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-256.c
# Opt level: O2

void pp_crypto_hash_sha2_256_process(PHashSHA2_256 *ctx,puint32 *data)

{
  puint32 pVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  puint32 local_178 [4];
  uint local_168 [12];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  uint auStack_f8 [50];
  
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    local_178[lVar3 + 4] = ctx->hash[lVar3];
  }
  local_108 = *(undefined8 *)(data + 0xc);
  uStack_100 = *(undefined8 *)(data + 0xe);
  local_118 = *(undefined8 *)(data + 8);
  uStack_110 = *(undefined8 *)(data + 10);
  local_128 = *(undefined8 *)(data + 4);
  uStack_120 = *(undefined8 *)(data + 6);
  local_138 = *(undefined8 *)data;
  uStack_130 = *(undefined8 *)(data + 2);
  for (uVar16 = 0; uVar16 < 0x10; uVar16 = uVar16 + 8) {
    iVar8 = ((local_168[4] << 7 | local_168[4] >> 0x19) ^
            (local_168[4] << 0x15 | local_168[4] >> 0xb) ^
            (local_168[4] << 0x1a | local_168[4] >> 6)) + local_168[7] +
            pp_crypto_hash_sha2_256_K[uVar16] + *(int *)((long)&local_138 + uVar16 * 4) +
            ((local_168[5] ^ local_168[6]) & local_168[4] ^ local_168[6]);
    uVar2 = local_168[3] + iVar8;
    iVar11 = ((local_168[5] ^ local_168[4]) & uVar2 ^ local_168[5]) + local_168[6] +
             pp_crypto_hash_sha2_256_K[uVar16 + 1] +
             ((uVar2 * 0x80 | uVar2 >> 0x19) ^
             (uVar2 * 0x200000 | uVar2 >> 0xb) ^ (uVar2 * 0x4000000 | uVar2 >> 6)) +
             *(int *)((long)&local_138 + uVar16 * 4 + 4);
    uVar14 = ((local_168[1] | local_168[0]) & local_168[2] | local_168[1] & local_168[0]) +
             ((local_168[0] << 10 | local_168[0] >> 0x16) ^
             (local_168[0] << 0x13 | local_168[0] >> 0xd) ^
             (local_168[0] << 0x1e | local_168[0] >> 2)) + iVar8;
    uVar4 = local_168[2] + iVar11;
    uVar9 = ((uVar14 | local_168[0]) & local_168[1] | uVar14 & local_168[0]) +
            ((uVar14 * 0x400 | uVar14 >> 0x16) ^
            (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar11;
    iVar8 = local_168[5] + pp_crypto_hash_sha2_256_K[uVar16 + 2] +
            *(int *)((long)&uStack_130 + uVar16 * 4) +
            ((uVar2 ^ local_168[4]) & uVar4 ^ local_168[4]) +
            ((uVar4 * 0x80 | uVar4 >> 0x19) ^
            (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6));
    uVar5 = local_168[1] + iVar8;
    uVar12 = ((uVar9 | uVar14) & local_168[0] | uVar9 & uVar14) +
             ((uVar9 * 0x400 | uVar9 >> 0x16) ^
             (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar8;
    iVar8 = local_168[4] + pp_crypto_hash_sha2_256_K[uVar16 + 3] +
            *(int *)((long)&uStack_130 + uVar16 * 4 + 4) + ((uVar4 ^ uVar2) & uVar5 ^ uVar2) +
            ((uVar5 * 0x80 | uVar5 >> 0x19) ^
            (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6));
    uVar7 = local_168[0] + iVar8;
    uVar6 = ((uVar12 | uVar9) & uVar14 | uVar12 & uVar9) +
            ((uVar12 * 0x400 | uVar12 >> 0x16) ^
            (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar8;
    iVar8 = uVar2 + pp_crypto_hash_sha2_256_K[uVar16 + 4] + *(int *)((long)&local_128 + uVar16 * 4)
            + ((uVar5 ^ uVar4) & uVar7 ^ uVar4) +
            ((uVar7 * 0x80 | uVar7 >> 0x19) ^
            (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6));
    local_168[7] = uVar14 + iVar8;
    local_168[3] = iVar8 + ((uVar6 | uVar12) & uVar9 | uVar6 & uVar12) +
                           ((uVar6 * 0x400 | uVar6 >> 0x16) ^
                           (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2));
    iVar8 = uVar4 + pp_crypto_hash_sha2_256_K[uVar16 + 5] +
            *(int *)((long)&local_128 + uVar16 * 4 + 4) + ((uVar7 ^ uVar5) & local_168[7] ^ uVar5) +
            ((local_168[7] * 0x80 | local_168[7] >> 0x19) ^
            (local_168[7] * 0x200000 | local_168[7] >> 0xb) ^
            (local_168[7] * 0x4000000 | local_168[7] >> 6));
    local_168[6] = uVar9 + iVar8;
    local_168[2] = iVar8 + ((local_168[3] | uVar6) & uVar12 | local_168[3] & uVar6) +
                           ((local_168[3] * 0x400 | local_168[3] >> 0x16) ^
                           (local_168[3] * 0x80000 | local_168[3] >> 0xd) ^
                           (local_168[3] * 0x40000000 | local_168[3] >> 2));
    iVar8 = uVar5 + pp_crypto_hash_sha2_256_K[uVar16 + 6] + *(int *)((long)&uStack_120 + uVar16 * 4)
            + ((local_168[7] ^ uVar7) & local_168[6] ^ uVar7) +
            ((local_168[6] * 0x80 | local_168[6] >> 0x19) ^
            (local_168[6] * 0x200000 | local_168[6] >> 0xb) ^
            (local_168[6] * 0x4000000 | local_168[6] >> 6));
    local_168[5] = uVar12 + iVar8;
    local_168[1] = iVar8 + ((local_168[2] | local_168[3]) & uVar6 | local_168[2] & local_168[3]) +
                           ((local_168[2] * 0x400 | local_168[2] >> 0x16) ^
                           (local_168[2] * 0x80000 | local_168[2] >> 0xd) ^
                           (local_168[2] * 0x40000000 | local_168[2] >> 2));
    iVar8 = uVar7 + pp_crypto_hash_sha2_256_K[uVar16 + 7] +
            *(int *)((long)&uStack_120 + uVar16 * 4 + 4) +
            ((local_168[6] ^ local_168[7]) & local_168[5] ^ local_168[7]) +
            ((local_168[5] * 0x80 | local_168[5] >> 0x19) ^
            (local_168[5] * 0x200000 | local_168[5] >> 0xb) ^
            (local_168[5] * 0x4000000 | local_168[5] >> 6));
    local_168[4] = uVar6 + iVar8;
    local_168[0] = iVar8 + ((local_168[1] | local_168[2]) & local_168[3] |
                           local_168[1] & local_168[2]) +
                           ((local_168[1] * 0x400 | local_168[1] >> 0x16) ^
                           (local_168[1] * 0x80000 | local_168[1] >> 0xd) ^
                           (local_168[1] * 0x40000000 | local_168[1] >> 2));
  }
  for (uVar16 = 0x10; uVar16 < 0x40; uVar16 = uVar16 + 8) {
    uVar2 = local_178[uVar16 + 0xe];
    uVar4 = local_178[uVar16 + 1];
    uVar5 = local_178[uVar16 + 2];
    uVar18 = (uVar2 >> 10 ^ (uVar2 << 0xd | uVar2 >> 0x13) ^ (uVar2 << 0xf | uVar2 >> 0x11)) +
             local_178[uVar16 + 9] + local_178[uVar16] +
             (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
    pVar1 = pp_crypto_hash_sha2_256_K[uVar16];
    *(uint *)((long)&local_138 + uVar16 * 4) = uVar18;
    iVar8 = ((local_168[4] << 7 | local_168[4] >> 0x19) ^
            (local_168[4] << 0x15 | local_168[4] >> 0xb) ^
            (local_168[4] << 0x1a | local_168[4] >> 6)) + local_168[7] + pVar1 +
            ((local_168[5] ^ local_168[6]) & local_168[4] ^ local_168[6]) + uVar18;
    uVar6 = local_168[3] + iVar8;
    uVar15 = ((local_168[1] | local_168[0]) & local_168[2] | local_168[1] & local_168[0]) +
             ((local_168[0] << 10 | local_168[0] >> 0x16) ^
             (local_168[0] << 0x13 | local_168[0] >> 0xd) ^
             (local_168[0] << 0x1e | local_168[0] >> 2)) + iVar8;
    uVar2 = local_178[uVar16 + 0xf];
    uVar12 = uVar4 + local_178[uVar16 + 10] +
             (uVar2 >> 10 ^ (uVar2 << 0xd | uVar2 >> 0x13) ^ (uVar2 << 0xf | uVar2 >> 0x11)) +
             (uVar5 >> 3 ^ (uVar5 << 0xe | uVar5 >> 0x12) ^ (uVar5 << 0x19 | uVar5 >> 7));
    pVar1 = pp_crypto_hash_sha2_256_K[uVar16 + 1];
    *(uint *)((long)&local_138 + uVar16 * 4 + 4) = uVar12;
    iVar8 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
            (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) + uVar12 +
            ((local_168[5] ^ local_168[4]) & uVar6 ^ local_168[5]) + local_168[6] + pVar1;
    uVar7 = local_168[2] + iVar8;
    uVar10 = ((uVar15 | local_168[0]) & local_168[1] | uVar15 & local_168[0]) +
             ((uVar15 * 0x400 | uVar15 >> 0x16) ^
             (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar8;
    uVar2 = local_178[uVar16 + 3];
    uVar5 = (uVar18 >> 10 ^ (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11))
            + uVar5 + local_178[uVar16 + 0xb] +
            (uVar2 >> 3 ^ (uVar2 << 0xe | uVar2 >> 0x12) ^ (uVar2 << 0x19 | uVar2 >> 7));
    pVar1 = pp_crypto_hash_sha2_256_K[uVar16 + 2];
    *(uint *)((long)&uStack_130 + uVar16 * 4) = uVar5;
    iVar8 = local_168[5] + pVar1 + ((uVar6 ^ local_168[4]) & uVar7 ^ local_168[4]) + uVar5 +
            ((uVar7 * 0x80 | uVar7 >> 0x19) ^
            (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6));
    uVar9 = local_168[1] + iVar8;
    uVar13 = ((uVar10 | uVar15) & local_168[0] | uVar10 & uVar15) +
             ((uVar10 * 0x400 | uVar10 >> 0x16) ^
             (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar8;
    uVar4 = local_178[uVar16 + 4];
    uVar12 = (uVar12 >> 10 ^ (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11)
             ) + uVar2 + local_178[uVar16 + 0xc] +
             (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
    *(uint *)((long)&uStack_130 + uVar16 * 4 + 4) = uVar12;
    iVar8 = local_168[4] + pp_crypto_hash_sha2_256_K[uVar16 + 3] + uVar12 +
            ((uVar7 ^ uVar6) & uVar9 ^ uVar6) +
            ((uVar9 * 0x80 | uVar9 >> 0x19) ^
            (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6));
    uVar14 = local_168[0] + iVar8;
    uVar17 = ((uVar13 | uVar10) & uVar15 | uVar13 & uVar10) +
             ((uVar13 * 0x400 | uVar13 >> 0x16) ^
             (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar8;
    uVar2 = local_178[uVar16 + 5];
    uVar19 = (uVar5 >> 10 ^ (uVar5 * 0x2000 | uVar5 >> 0x13) ^ (uVar5 * 0x8000 | uVar5 >> 0x11)) +
             uVar4 + local_178[uVar16 + 0xd] +
             (uVar2 >> 3 ^ (uVar2 << 0xe | uVar2 >> 0x12) ^ (uVar2 << 0x19 | uVar2 >> 7));
    *(uint *)((long)&local_128 + uVar16 * 4) = uVar19;
    iVar8 = uVar6 + pp_crypto_hash_sha2_256_K[uVar16 + 4] + uVar19 +
            ((uVar9 ^ uVar7) & uVar14 ^ uVar7) +
            ((uVar14 * 0x80 | uVar14 >> 0x19) ^
            (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6));
    local_168[7] = uVar15 + iVar8;
    local_168[3] = iVar8 + ((uVar17 | uVar13) & uVar10 | uVar17 & uVar13) +
                           ((uVar17 * 0x400 | uVar17 >> 0x16) ^
                           (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2))
    ;
    uVar4 = local_178[uVar16 + 6];
    uVar5 = local_178[uVar16 + 7];
    uVar6 = (uVar12 >> 10 ^ (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11))
            + uVar2 + local_178[uVar16 + 0xe] +
            (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
    iVar8 = uVar7 + pp_crypto_hash_sha2_256_K[uVar16 + 5] + uVar6 +
            ((uVar14 ^ uVar9) & local_168[7] ^ uVar9) +
            ((local_168[7] * 0x80 | local_168[7] >> 0x19) ^
            (local_168[7] * 0x200000 | local_168[7] >> 0xb) ^
            (local_168[7] * 0x4000000 | local_168[7] >> 6));
    local_168[6] = uVar10 + iVar8;
    local_168[2] = iVar8 + ((local_168[3] | uVar17) & uVar13 | local_168[3] & uVar17) +
                           ((local_168[3] * 0x400 | local_168[3] >> 0x16) ^
                           (local_168[3] * 0x80000 | local_168[3] >> 0xd) ^
                           (local_168[3] * 0x40000000 | local_168[3] >> 2));
    *(uint *)((long)&local_128 + uVar16 * 4 + 4) = uVar6;
    iVar8 = (uVar19 >> 10 ^ (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11))
            + uVar4 + local_178[uVar16 + 0xf] +
            (uVar5 >> 3 ^ (uVar5 << 0xe | uVar5 >> 0x12) ^ (uVar5 << 0x19 | uVar5 >> 7));
    *(int *)((long)&uStack_120 + uVar16 * 4) = iVar8;
    iVar8 = uVar9 + pp_crypto_hash_sha2_256_K[uVar16 + 6] + iVar8 +
            ((local_168[7] ^ uVar14) & local_168[6] ^ uVar14) +
            ((local_168[6] * 0x80 | local_168[6] >> 0x19) ^
            (local_168[6] * 0x200000 | local_168[6] >> 0xb) ^
            (local_168[6] * 0x4000000 | local_168[6] >> 6));
    local_168[5] = uVar13 + iVar8;
    local_168[1] = iVar8 + ((local_168[2] | local_168[3]) & uVar17 | local_168[2] & local_168[3]) +
                           ((local_168[2] * 0x400 | local_168[2] >> 0x16) ^
                           (local_168[2] * 0x80000 | local_168[2] >> 0xd) ^
                           (local_168[2] * 0x40000000 | local_168[2] >> 2));
    uVar2 = local_178[uVar16 + 8];
    iVar8 = uVar18 + uVar5 +
            (uVar2 >> 3 ^ (uVar2 << 0xe | uVar2 >> 0x12) ^ (uVar2 << 0x19 | uVar2 >> 7)) +
            (uVar6 >> 10 ^ (uVar6 * 0x2000 | uVar6 >> 0x13) ^ (uVar6 * 0x8000 | uVar6 >> 0x11));
    *(int *)((long)&uStack_120 + uVar16 * 4 + 4) = iVar8;
    iVar8 = uVar14 + pp_crypto_hash_sha2_256_K[uVar16 + 7] + iVar8 +
            ((local_168[6] ^ local_168[7]) & local_168[5] ^ local_168[7]) +
            ((local_168[5] * 0x80 | local_168[5] >> 0x19) ^
            (local_168[5] * 0x200000 | local_168[5] >> 0xb) ^
            (local_168[5] * 0x4000000 | local_168[5] >> 6));
    local_168[4] = uVar17 + iVar8;
    local_168[0] = iVar8 + ((local_168[1] | local_168[2]) & local_168[3] |
                           local_168[1] & local_168[2]) +
                           ((local_168[1] * 0x400 | local_168[1] >> 0x16) ^
                           (local_168[1] * 0x80000 | local_168[1] >> 0xd) ^
                           (local_168[1] * 0x40000000 | local_168[1] >> 2));
  }
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    ctx->hash[lVar3] = ctx->hash[lVar3] + local_178[lVar3 + 4];
  }
  return;
}

Assistant:

static void
pp_crypto_hash_sha2_256_process (PHashSHA2_256	*ctx,
				 const puint32	data[16])
{
	puint32	tmp_sum1;
	puint32	tmp_sum2;
	puint32 W[64];
	puint32	A[8];
	puint	i;

	for (i = 0; i < 8; i++)
		A[i] = ctx->hash[i];

	memcpy (W, data, 64);

	for (i = 0; i < 16; i += 8) {
		P_SHA2_256_P (A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i + 0], pp_crypto_hash_sha2_256_K[i + 0])
		P_SHA2_256_P (A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], W[i + 1], pp_crypto_hash_sha2_256_K[i + 1])
		P_SHA2_256_P (A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], W[i + 2], pp_crypto_hash_sha2_256_K[i + 2])
		P_SHA2_256_P (A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], W[i + 3], pp_crypto_hash_sha2_256_K[i + 3])
		P_SHA2_256_P (A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], W[i + 4], pp_crypto_hash_sha2_256_K[i + 4])
		P_SHA2_256_P (A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], W[i + 5], pp_crypto_hash_sha2_256_K[i + 5])
		P_SHA2_256_P (A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], W[i + 6], pp_crypto_hash_sha2_256_K[i + 6])
		P_SHA2_256_P (A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], W[i + 7], pp_crypto_hash_sha2_256_K[i + 7])
	}

	for (i = 16; i < 64; i += 8) {
		P_SHA2_256_P (A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], P_SHA2_256_R (i + 0), pp_crypto_hash_sha2_256_K[i + 0])
		P_SHA2_256_P (A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], P_SHA2_256_R (i + 1), pp_crypto_hash_sha2_256_K[i + 1])
		P_SHA2_256_P (A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], P_SHA2_256_R (i + 2), pp_crypto_hash_sha2_256_K[i + 2])
		P_SHA2_256_P (A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], P_SHA2_256_R (i + 3), pp_crypto_hash_sha2_256_K[i + 3])
		P_SHA2_256_P (A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], P_SHA2_256_R (i + 4), pp_crypto_hash_sha2_256_K[i + 4])
		P_SHA2_256_P (A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], P_SHA2_256_R (i + 5), pp_crypto_hash_sha2_256_K[i + 5])
		P_SHA2_256_P (A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], P_SHA2_256_R (i + 6), pp_crypto_hash_sha2_256_K[i + 6])
		P_SHA2_256_P (A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], P_SHA2_256_R (i + 7), pp_crypto_hash_sha2_256_K[i + 7])
	}

	for (i = 0; i < 8; i++)
		ctx->hash[i] += A[i];
}